

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

uint ON_MeshNgon::FindNgonBoundaries
               (ON_3dPointListRef *mesh_vertex_list,ON_MeshFaceList *mesh_face_list,
               ON_MeshVertexFaceMap *vertex_face_map,size_t ngon_fi_count,uint *ngon_fi,
               ON_SimpleArray<unsigned_int> *ngon_vi,ON_SimpleArray<unsigned_int> *ngon_vi_markers)

{
  double *pdVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint face_index_count;
  bool bVar6;
  ON_SimpleArray<NgonNeighbors> ngon_nbr_map;
  ON_SimpleArray<unsigned_int> tmp;
  ON_3dVector B;
  ON_3dVector A;
  ON_Plane ngon_plane;
  undefined1 local_170 [16];
  double dStack_160;
  ON_MeshFaceList *local_158;
  uint local_14c;
  ON_SimpleArray<NgonNeighbors> local_148;
  ON_SimpleArray<unsigned_int> local_130;
  double local_118;
  double local_110;
  ON_3dPointListRef *local_108;
  _func_int **local_100;
  ON_3dVector local_f8;
  ON_3dPoint local_e0;
  ON_3dVector local_c8;
  ON_Plane local_b0;
  
  uVar3 = mesh_vertex_list->m_point_count;
  if ((1 < uVar3 + 1) && (ngon_fi != (uint *)0x0 && ngon_fi_count != 0)) {
    local_148._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00823f00;
    local_148.m_a = (NgonNeighbors *)0x0;
    local_148.m_count = 0;
    local_148.m_capacity = 0;
    face_index_count = (uint)ngon_fi_count;
    local_158 = mesh_face_list;
    if ((ngon_fi_count & 0xffffffff) != 0) {
      ON_SimpleArray<NgonNeighbors>::SetCapacity(&local_148,ngon_fi_count & 0xffffffff);
    }
    if ((-1 < (int)face_index_count) && ((int)face_index_count <= local_148.m_capacity)) {
      local_148.m_count = face_index_count;
    }
    uVar3 = SetFaceNeighborMap(uVar3,local_158,(uint **)0x0,vertex_face_map,face_index_count,ngon_fi
                               ,local_148.m_a);
    if (-1 < ngon_vi->m_capacity) {
      ngon_vi->m_count = 0;
    }
    uVar4 = GetNgonBoundarySegments
                      (local_158,face_index_count,ngon_fi,1,local_148.m_a,ngon_vi,
                       (ON_SimpleArray<unsigned_int> *)0x0);
    if (uVar4 != 0) {
      local_b0.origin.x = (double)CONCAT44(local_b0.origin.x._4_4_,ngon_vi->m_count);
      ON_SimpleArray<unsigned_int>::Append(ngon_vi_markers,(uint *)&local_b0);
      if ((uint)ngon_vi->m_count < uVar3) {
        local_100 = (_func_int **)&PTR__ON_SimpleArray_0081c860;
        local_130._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c860;
        local_130.m_a = (uint *)0x0;
        local_130.m_count = 0;
        local_130.m_capacity = 0;
        uVar3 = ngon_vi->m_a[1];
        local_e0.x = -1.23432101234321e+308;
        local_b0.origin.x = -1.23432101234321e+308;
        local_b0.origin.y = -1.23432101234321e+308;
        local_b0.origin.z = -1.23432101234321e+308;
        if (uVar3 < mesh_vertex_list->m_point_count) {
          pdVar1 = mesh_vertex_list->m_dP;
          if (pdVar1 == (double *)0x0) {
            pfVar2 = mesh_vertex_list->m_fP;
            uVar5 = (ulong)(uVar3 * mesh_vertex_list->m_point_stride);
            local_b0.origin.x = (double)pfVar2[uVar5];
            local_b0.origin.y = (double)pfVar2[uVar5 + 1];
            local_b0.origin.z = (double)pfVar2[uVar5 + 2];
          }
          else {
            uVar5 = (ulong)(uVar3 * mesh_vertex_list->m_point_stride);
            local_b0.origin.x = pdVar1[uVar5];
            local_b0.origin.y = pdVar1[uVar5 + 1];
            local_b0.origin.z = pdVar1[uVar5 + 2];
          }
        }
        uVar3 = *ngon_vi->m_a;
        local_e0.y = -1.23432101234321e+308;
        local_e0.z = -1.23432101234321e+308;
        if (uVar3 < mesh_vertex_list->m_point_count) {
          pdVar1 = mesh_vertex_list->m_dP;
          if (pdVar1 == (double *)0x0) {
            pfVar2 = mesh_vertex_list->m_fP;
            uVar5 = (ulong)(uVar3 * mesh_vertex_list->m_point_stride);
            local_e0.x = (double)pfVar2[uVar5];
            local_e0.y = (double)pfVar2[uVar5 + 1];
            local_e0.z = (double)pfVar2[uVar5 + 2];
          }
          else {
            uVar5 = (ulong)(uVar3 * mesh_vertex_list->m_point_stride);
            local_e0.x = pdVar1[uVar5];
            local_e0.y = pdVar1[uVar5 + 1];
            local_e0.z = pdVar1[uVar5 + 2];
          }
        }
        ON_3dPoint::operator-(&local_c8,&local_b0.origin,&local_e0);
        uVar3 = ngon_vi->m_a[(long)ngon_vi->m_count + -1];
        local_170._0_8_ = (_func_int **)0xffe5f8bd9e331dd2;
        local_b0.origin.x = -1.23432101234321e+308;
        local_b0.origin.y = -1.23432101234321e+308;
        local_b0.origin.z = -1.23432101234321e+308;
        if (uVar3 < mesh_vertex_list->m_point_count) {
          pdVar1 = mesh_vertex_list->m_dP;
          if (pdVar1 == (double *)0x0) {
            pfVar2 = mesh_vertex_list->m_fP;
            uVar5 = (ulong)(uVar3 * mesh_vertex_list->m_point_stride);
            local_b0.origin.x = (double)pfVar2[uVar5];
            local_b0.origin.y = (double)pfVar2[uVar5 + 1];
            local_b0.origin.z = (double)pfVar2[uVar5 + 2];
          }
          else {
            uVar5 = (ulong)(uVar3 * mesh_vertex_list->m_point_stride);
            local_b0.origin.x = pdVar1[uVar5];
            local_b0.origin.y = pdVar1[uVar5 + 1];
            local_b0.origin.z = pdVar1[uVar5 + 2];
          }
        }
        uVar3 = *ngon_vi->m_a;
        local_170._8_8_ = (uint *)0xffe5f8bd9e331dd2;
        dStack_160 = -1.23432101234321e+308;
        if (uVar3 < mesh_vertex_list->m_point_count) {
          pdVar1 = mesh_vertex_list->m_dP;
          if (pdVar1 == (double *)0x0) {
            pfVar2 = mesh_vertex_list->m_fP;
            uVar5 = (ulong)(uVar3 * mesh_vertex_list->m_point_stride);
            local_170._0_8_ = (undefined8)pfVar2[uVar5];
            local_170._8_8_ = (undefined8)pfVar2[uVar5 + 1];
            dStack_160 = (double)pfVar2[uVar5 + 2];
          }
          else {
            uVar5 = (ulong)(uVar3 * mesh_vertex_list->m_point_stride);
            local_170._0_8_ = pdVar1[uVar5];
            local_170._8_8_ = pdVar1[uVar5 + 1];
            dStack_160 = pdVar1[uVar5 + 2];
          }
        }
        ON_3dPoint::operator-((ON_3dVector *)&local_e0,&local_b0.origin,(ON_3dPoint *)local_170);
        ON_3dVector::Unitize(&local_c8);
        ON_3dVector::Unitize((ON_3dVector *)&local_e0);
        uVar3 = *ngon_vi->m_a;
        if (uVar3 < mesh_vertex_list->m_point_count) {
          pdVar1 = mesh_vertex_list->m_dP;
          if (pdVar1 == (double *)0x0) {
            pfVar2 = mesh_vertex_list->m_fP;
            uVar5 = (ulong)(uVar3 * mesh_vertex_list->m_point_stride);
            local_170._0_8_ = (undefined8)pfVar2[uVar5];
            local_170._8_8_ = (undefined8)pfVar2[uVar5 + 1];
            dStack_160 = (double)pfVar2[uVar5 + 2];
          }
          else {
            uVar5 = (ulong)(uVar3 * mesh_vertex_list->m_point_stride);
            local_170._0_8_ = pdVar1[uVar5];
            local_170._8_8_ = pdVar1[uVar5 + 1];
            dStack_160 = pdVar1[uVar5 + 2];
          }
        }
        else {
          local_170._0_8_ = (_func_int **)0xffe5f8bd9e331dd2;
          local_170._8_8_ = (uint *)0xffe5f8bd9e331dd2;
          dStack_160 = -1.23432101234321e+308;
        }
        ON_CrossProduct(&local_f8,&local_c8,(ON_3dVector *)&local_e0);
        ON_Plane::ON_Plane(&local_b0,(ON_3dPoint *)local_170,&local_f8);
        local_14c = uVar4;
        local_108 = mesh_vertex_list;
        local_118 = Internal_NgonBoundaryArea(&local_b0,mesh_vertex_list,ngon_vi);
        uVar3 = 2;
        do {
          local_170._0_8_ = local_100;
          local_170._8_8_ = (uint *)0x0;
          dStack_160 = 0.0;
          uVar4 = GetNgonBoundarySegments
                            (local_158,face_index_count,ngon_fi,uVar3,local_148.m_a,
                             (ON_SimpleArray<unsigned_int> *)local_170,
                             (ON_SimpleArray<unsigned_int> *)0x0);
          bVar6 = 2 < dStack_160._0_4_;
          if (bVar6 && uVar4 != 0) {
            local_110 = Internal_NgonBoundaryArea
                                  (&local_b0,local_108,(ON_SimpleArray<unsigned_int> *)local_170);
            if (local_110 <= local_118) {
              local_f8.x._0_4_ = dStack_160._0_4_;
              ON_SimpleArray<unsigned_int>::Append(ngon_vi_markers,(uint *)&local_f8);
              ON_SimpleArray<unsigned_int>::Append(ngon_vi,dStack_160._0_4_,(uint *)local_170._8_8_)
              ;
            }
            else {
              if (local_130.m_a != (uint *)0x0) {
                memset(local_130.m_a,0,(long)local_130.m_capacity << 2);
              }
              local_130._16_8_ = local_130._16_8_ & 0xffffffff00000000;
              ON_SimpleArray<unsigned_int>::Append
                        (&local_130,dStack_160._0_4_,(uint *)local_170._8_8_);
              ON_SimpleArray<unsigned_int>::Append(&local_130,ngon_vi->m_count,ngon_vi->m_a);
              ON_SimpleArray<unsigned_int>::operator=(ngon_vi,&local_130);
              local_f8.x._0_4_ = dStack_160._0_4_;
              ON_SimpleArray<unsigned_int>::Insert(ngon_vi_markers,0,(uint *)&local_f8);
              local_118 = local_110;
            }
          }
          ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)local_170);
          uVar3 = uVar3 + 1;
        } while (bVar6 && uVar4 != 0);
        ON_Plane::~ON_Plane(&local_b0);
        ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_130);
        uVar4 = local_14c;
      }
      uVar3 = ngon_vi->m_count;
    }
    ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray(&local_148);
    if (uVar4 != 0) {
      return uVar3;
    }
  }
  if (-1 < ngon_vi->m_capacity) {
    ngon_vi->m_count = 0;
  }
  return 0;
}

Assistant:

unsigned int ON_MeshNgon::FindNgonBoundaries(
  const class ON_3dPointListRef& mesh_vertex_list,
  const class ON_MeshFaceList& mesh_face_list,
  ON_MeshVertexFaceMap* vertex_face_map,
  size_t ngon_fi_count,
  const unsigned int* ngon_fi,
  ON_SimpleArray<unsigned int>& ngon_vi,
  ON_SimpleArray<unsigned int>& ngon_vi_markers
)
{
  return FindNgonBoundaries_Helper(
    mesh_vertex_list,
    mesh_face_list,
    nullptr,
    vertex_face_map,
    ngon_fi_count,
    ngon_fi,
    ngon_vi,
    ngon_vi_markers,
    false
  );
}